

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_tuv(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_DBL *param)

{
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT geom;
  REF_DBL *param_local;
  int local_20;
  REF_INT id_local;
  REF_INT type_local;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  _ref_private_macro_code_rss = param;
  param_local._4_4_ = id;
  local_20 = type;
  id_local = node;
  _type_local = ref_geom;
  ref_private_status_reis_ai._0_4_ =
       ref_geom_find(ref_geom,node,type,id,(REF_INT *)((long)&ref_private_status_reis_ai + 4));
  if ((uint)ref_private_status_reis_ai == 0) {
    if ((long)_type_local->descr[ref_private_status_reis_ai._4_4_ * 6 + 3] == 0) {
      if ((long)_type_local->descr[ref_private_status_reis_ai._4_4_ * 6 + 4] == 0) {
        if (0 < local_20) {
          *_ref_private_macro_code_rss = _type_local->param[ref_private_status_reis_ai._4_4_ << 1];
        }
        if (1 < local_20) {
          _ref_private_macro_code_rss[1] =
               _type_local->param[ref_private_status_reis_ai._4_4_ * 2 + 1];
        }
        ref_geom_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x2b3,"ref_geom_tuv","use ref_geom_cell_tuv for degen",0,
               (long)_type_local->descr[ref_private_status_reis_ai._4_4_ * 6 + 4]);
        ref_geom_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2b2,
             "ref_geom_tuv","use ref_geom_cell_tuv for jumps",0,
             (long)_type_local->descr[ref_private_status_reis_ai._4_4_ * 6 + 3]);
      ref_geom_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x2b0,
           "ref_geom_tuv",(ulong)(uint)ref_private_status_reis_ai,"not found");
    ref_geom_local._4_4_ = (uint)ref_private_status_reis_ai;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tuv(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                REF_INT id, REF_DBL *param) {
  REF_INT geom;

  RSS(ref_geom_find(ref_geom, node, type, id, &geom), "not found");

  REIS(0, ref_geom_jump(ref_geom, geom), "use ref_geom_cell_tuv for jumps");
  REIS(0, ref_geom_degen(ref_geom, geom), "use ref_geom_cell_tuv for degen");

  if (type > 0) param[0] = ref_geom_param(ref_geom, 0, geom);
  if (type > 1) param[1] = ref_geom_param(ref_geom, 1, geom);

  return REF_SUCCESS;
}